

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O0

void __thiscall
object_tools::save_skl(object_tools *this,xr_object *object,char *source,cl_parser *cl)

{
  xr_skl_motion *this_00;
  bool bVar1;
  bool bVar2;
  xr_skl_motion_vec *this_01;
  reference ppxVar3;
  string *psVar4;
  ulong uVar5;
  char *path;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string target;
  string name;
  xr_skl_motion *el;
  iterator __end1;
  iterator __begin1;
  xr_skl_motion_vec *__range1;
  undefined1 local_78 [7];
  bool found;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  filter;
  undefined1 local_48 [8];
  string motion_name;
  cl_parser *cl_local;
  char *source_local;
  xr_object *object_local;
  object_tools *this_local;
  
  motion_name.field_2._8_8_ = cl;
  std::__cxx11::string::string((string *)local_48);
  cl_parser::get_string((cl_parser *)motion_name.field_2._8_8_,"-skl",(string *)local_48);
  create_filter((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)local_78,(string *)local_48);
  bVar2 = false;
  this_01 = xray_re::xr_object::motions(object);
  __end1 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::begin
                     (this_01);
  el = (xr_skl_motion *)
       std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::end
                 (this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
                                     *)&el), bVar1) {
    ppxVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppxVar3;
    psVar4 = xray_re::xr_motion::name_abi_cxx11_(&this_00->super_xr_motion);
    bVar1 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_78,psVar4);
    if (bVar1) {
      psVar4 = xray_re::xr_motion::name_abi_cxx11_(&this_00->super_xr_motion);
      std::__cxx11::string::string((string *)(target.field_2._M_local_buf + 8),(string *)psVar4);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::string
                  ((string *)local_e0,(string *)&(this->super_batch_helper).m_output_file);
      }
      else {
        std::operator+(&local_100,&(this->super_batch_helper).m_output_folder,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&target.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,&local_100,".skl");
        std::__cxx11::string::~string((string *)&local_100);
      }
      path = (char *)std::__cxx11::string::c_str();
      bVar2 = xray_re::xr_skl_motion::save_skl(this_00,path);
      if (!bVar2) {
        uVar6 = std::__cxx11::string::c_str();
        xray_re::msg("can\'t save %s",uVar6);
      }
      bVar2 = true;
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_skl_motion_**,_std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>_>
    ::operator++(&__end1);
  }
  if (!bVar2) {
    uVar6 = std::__cxx11::string::c_str();
    xray_re::msg("can\'t find motion %s",uVar6);
  }
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void object_tools::save_skl(xray_re::xr_object& object, const char* source, const cl_parser& cl) const
{
	std::string motion_name;
	cl.get_string("-skl", motion_name);

	auto filter = create_filter(motion_name);

	bool found = false;
	for (auto el : object.motions()) {
		if (!filter(el->name()))
			continue;

		std::string name{ el->name() };
		std::string target = m_output_file.empty() ? m_output_folder + name + ".skl" : m_output_file;
		if (!el->save_skl(target.c_str()))
			msg("can't save %s", target.c_str());

		found = true;
	}
	if (!found)
		msg("can't find motion %s", motion_name.c_str());
}